

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

mg_context * mg_start2(mg_init_data *init,mg_error_data *error)

{
  undefined8 *puVar1;
  byte bVar2;
  pthread_mutexattr_t *__src;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  __uid_t _Var9;
  size_t sVar10;
  pthread_mutexattr_t *ctx;
  uint64_t uVar11;
  uint *puVar12;
  void *pvVar13;
  socket *psVar14;
  undefined4 extraout_var;
  char *pcVar15;
  ulong uVar16;
  pollfd *ppVar17;
  passwd *ppVar18;
  pthread_t *ppVar19;
  mg_connection *pmVar20;
  int *piVar21;
  ulong in_RCX;
  size_t sVar22;
  char *func;
  char *func_00;
  char *func_01;
  char *func_02;
  char *func_03;
  mg_file_stat *filep;
  char *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  char *func_04;
  char *func_05;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  uint *extraout_RDX_11;
  char *extraout_RDX_12;
  char *func_06;
  mg_context *ctx_00;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *func_07;
  char *func_08;
  char *func_09;
  char *extraout_RDX_15;
  char *func_10;
  char *func_11;
  char *extraout_RDX_16;
  char *func_12;
  char *extraout_RDX_17;
  char *func_13;
  char *extraout_RDX_18;
  char *pcVar23;
  long lVar24;
  int *piVar25;
  pthread_mutexattr_t *ctx_01;
  char *pcVar26;
  char *pcVar27;
  char *fmt;
  char **ppcVar28;
  char **ppcVar29;
  mg_error_data *pmVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  uint uStack_330;
  int len;
  mg_error_data *local_318;
  uint port;
  vec vec;
  socklen_t local_2ec;
  undefined1 local_2e8 [6];
  ushort uStack_2e2;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined1 auStack_2b0 [5];
  bool bStack_2ab;
  undefined2 uStack_2aa;
  int local_2a0;
  int on;
  _func_void_mg_context_ptr *local_298;
  int off;
  uint d;
  uint c;
  uint b;
  uint a;
  ulong local_278;
  char *endptr;
  usa usa;
  char buf [100];
  mg_workerTLS tls;
  utsname name;
  
  if (init == (mg_init_data *)0x0) {
    ppcVar29 = (char **)0x0;
  }
  else {
    ppcVar29 = init->configuration_options;
  }
  if ((error != (mg_error_data *)0x0) &&
     (error->code = 0, error->code_sub = 0, error->text_buffer_size != 0)) {
    *error->text = '\0';
  }
  if (mg_init_library_called == 0) {
    if (ppcVar29 == (char **)0x0) {
      pcVar23 = "8080";
LAB_00118d1f:
      sVar10 = strlen(pcVar23);
      uVar7 = 0;
      uVar32 = sVar10 & 0xffffffff;
      if ((int)sVar10 < 1) {
        uVar32 = 0;
      }
      bVar33 = false;
      for (in_RCX = 0; uVar32 != in_RCX; in_RCX = in_RCX + 1) {
        if ((bool)(bVar33 & (pcVar23[in_RCX] & 0xfeU) == 0x72)) {
          uVar7 = 2;
          break;
        }
        bVar33 = (byte)(pcVar23[in_RCX] - 0x30U) < 10;
      }
    }
    else {
      pcVar23 = "8080";
      for (ppcVar28 = ppcVar29 + 1; ppcVar28[-1] != (char *)0x0; ppcVar28 = ppcVar28 + 2) {
        iVar3 = strcmp(ppcVar28[-1],"listening_ports");
        if (iVar3 == 0) {
          pcVar23 = *ppcVar28;
        }
      }
      if (pcVar23 != (char *)0x0) goto LAB_00118d1f;
      uVar7 = 0;
    }
    mg_init_library(uVar7);
    if (mg_init_library_called == 0) {
      if (error == (mg_error_data *)0x0) {
        return (mg_context *)0x0;
      }
      error->code = 8;
      pcVar23 = error->text;
      sVar22 = error->text_buffer_size;
      pcVar15 = "Library uninitialized";
      goto LAB_00118f20;
    }
  }
  local_318 = error;
  ctx = (pthread_mutexattr_t *)calloc(1,0x285a8);
  if (ctx == (pthread_mutexattr_t *)0x0) {
    if (local_318 == (mg_error_data *)0x0) {
      return (mg_context *)0x0;
    }
    local_318->code = 6;
    local_318->code_sub = 0x285a8;
    pcVar23 = local_318->text;
    sVar22 = local_318->text_buffer_size;
    pcVar15 = "Out of memory";
LAB_00118f20:
    mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar23,sVar22,"%s",pcVar15);
    return (mg_context *)0x0;
  }
  uVar11 = get_random();
  *(uint64_t *)(ctx->__size + 0x28590) = uVar11 ^ (ulong)ppcVar29;
  LOCK();
  UNLOCK();
  tls.is_master = -1;
  tls.thread_idx = (unsigned_long)((int)thread_idx_max + 1);
  thread_idx_max = thread_idx_max + 1;
  *(unsigned_long *)(ctx->__size + 0x70) = tls.thread_idx;
  pthread_setspecific(sTlsKey,&tls);
  iVar3 = pthread_mutex_init((pthread_mutex_t *)(ctx->__size + 0x30),
                             (pthread_mutexattr_t *)&pthread_mutex_attr);
  iVar4 = pthread_cond_init((pthread_cond_t *)(ctx->__size + 0xb8),(pthread_condattr_t *)0x0);
  iVar5 = pthread_cond_init((pthread_cond_t *)(ctx->__size + 0x88),(pthread_condattr_t *)0x0);
  *(int *)(ctx->__size + 0xe8) = 0;
  ctx_01 = &pthread_mutex_attr;
  iVar6 = pthread_mutex_init((pthread_mutex_t *)(ctx->__size + 0x282e8),
                             (pthread_mutexattr_t *)&pthread_mutex_attr);
  uVar7 = (uint)in_RCX;
  if (iVar6 == 0 && (iVar5 == 0 && (iVar4 == 0 && iVar3 == 0))) {
    if (init == (mg_init_data *)0x0) {
      local_298 = (_func_void_mg_context_ptr *)0x0;
      pvVar13 = (void *)0x0;
    }
    else {
      __src = (pthread_mutexattr_t *)init->callbacks;
      if (__src == (pthread_mutexattr_t *)0x0) {
        local_298 = (_func_void_mg_context_ptr *)0x0;
      }
      else {
        ctx_01 = __src;
        memcpy((mg_callbacks *)(ctx->__size + 0x28310),__src,0x90);
        local_298 = *(_func_void_mg_context_ptr **)(__src->__size + 0x70);
        *(_func_void_mg_context_ptr **)(ctx->__size + 0x28380) = (_func_void_mg_context_ptr *)0x0;
      }
      pvVar13 = init->user_data;
    }
    *(void **)(ctx->__size + 0x283a0) = pvVar13;
    *(mg_handler_info **)(ctx->__size + 0x28580) = (mg_handler_info *)0x0;
    *(mg_domain_context **)(ctx->__size + 0x285a0) = (mg_domain_context *)0x0;
    for (; (ppcVar29 != (char **)0x0 && (pcVar23 = *ppcVar29, pcVar23 != (char *)0x0));
        ppcVar29 = ppcVar29 + 2) {
      uVar7 = get_option_index(pcVar23);
      uVar8 = (uint)in_RCX;
      if (uVar7 == 0xffffffff) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_00,uVar8,"Invalid option: %s",pcVar23
                  );
        if (local_318 == (mg_error_data *)0x0) goto LAB_0011925f;
        local_318->code = 2;
        local_318->code_sub = 0xffffffff;
        pcVar15 = local_318->text;
        sVar22 = local_318->text_buffer_size;
        pcVar26 = "Invalid configuration option: %s";
        goto LAB_00119258;
      }
      pcVar15 = ppcVar29[1];
      if (pcVar15 == (char *)0x0) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_00,uVar8,
                   "%s: option value cannot be NULL",pcVar23);
        if (local_318 == (mg_error_data *)0x0) goto LAB_0011925f;
        local_318->code = 2;
        local_318->code_sub = uVar7;
        pcVar15 = local_318->text;
        sVar22 = local_318->text_buffer_size;
        pcVar26 = "Invalid configuration option value: %s";
        goto LAB_00119258;
      }
      lVar24 = (long)(int)uVar7;
      if (*(long *)(ctx + lVar24 * 2 + 0xa0ec) != 0) {
        ctx_01 = ctx;
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_00,uVar8,
                   "warning: %s: duplicate option",pcVar23);
        free(*(void **)(ctx + lVar24 * 2 + 0xa0ec));
      }
      pcVar23 = mg_strdup_ctx(pcVar15,(mg_context *)ctx_01);
      *(char **)(ctx + lVar24 * 2 + 0xa0ec) = pcVar23;
    }
    ppcVar29 = &config_options[0].default_value;
    for (uVar32 = 0; uVar7 = (uint)in_RCX, (int)uVar32 != 0x3a; uVar32 = uVar32 + 1) {
      bVar33 = (0x27d9817c8447ddbU >> (uVar32 & 0x3f) & 1) != 0;
      in_RCX = CONCAT71((int7)(in_RCX >> 8),bVar33);
      if ((*(long *)(ctx + uVar32 * 2 + 0xa0ec) == 0) && (bVar33)) {
        pcVar23 = mg_strdup_ctx(*ppcVar29,(mg_context *)ctx_01);
        *(char **)(ctx + uVar32 * 2 + 0xa0ec) = pcVar23;
      }
      ppcVar29 = ppcVar29 + 3;
    }
    uVar8 = atoi(*(char **)(ctx->__size + 0x283d0));
    if ((int)uVar8 < 0x400) {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,(mg_context *)ctx,func_01,uVar7,"%s too small",
                 "max_request_size");
      if (local_318 != (mg_error_data *)0x0) {
        local_318->code = 2;
        local_318->code_sub = 4;
        pcVar15 = local_318->text;
        sVar22 = local_318->text_buffer_size;
        pcVar26 = "Invalid configuration option value: %s";
        pcVar23 = "max_request_size";
        goto LAB_00119258;
      }
    }
    else {
      *(uint *)(ctx->__size + 0xf0) = uVar8;
      uVar8 = atoi(*(char **)(ctx->__size + 0x283e0));
      pmVar30 = local_318;
      if ((int)uVar8 < 1) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_02,uVar7,"%s too small",
                   "connection_queue");
        if (pmVar30 != (mg_error_data *)0x0) {
          pmVar30->code = 2;
          pmVar30->code_sub = 6;
          pcVar15 = pmVar30->text;
          sVar22 = pmVar30->text_buffer_size;
          pcVar26 = "Invalid configuration option value: %s";
LAB_0011924d:
          pcVar23 = "connection_queue";
LAB_00119258:
          mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar15,sVar22,pcVar26,pcVar23);
        }
      }
      else {
        psVar14 = (socket *)calloc((ulong)uVar8,0x40);
        *(socket **)(ctx->__size + 0x78) = psVar14;
        if (psVar14 == (socket *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,(mg_context *)ctx,func_03,uVar7,
                     "Out of memory: Cannot allocate %s","connection_queue");
          if (pmVar30 != (mg_error_data *)0x0) {
            pmVar30->code = 6;
            pmVar30->code_sub = uVar8 << 6;
            pcVar15 = pmVar30->text;
            sVar22 = pmVar30->text_buffer_size;
            pcVar26 = "Out of memory: Cannot allocate %s";
            goto LAB_0011924d;
          }
        }
        else {
          *(uint *)(ctx->__size + 0xec) = uVar8;
          iVar3 = atoi(*(char **)(ctx->__size + 0x283b8));
          uVar7 = iVar3 - 0x10001;
          pcVar23 = (char *)(ulong)uVar7;
          if (uVar7 < 0xffff0000) {
            pcVar23 = "Too many worker threads";
            if (iVar3 < 1) {
              pcVar23 = "Invalid number of worker threads";
            }
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)ctx,(char *)0xfffeffff,uVar7,"%s",pcVar23)
            ;
            if (pmVar30 != (mg_error_data *)0x0) {
              pmVar30->code = 2;
              pmVar30->code_sub = 1;
              pcVar15 = pmVar30->text;
              sVar22 = pmVar30->text_buffer_size;
              pcVar26 = "Invalid configuration option value: %s";
              pcVar23 = "num_threads";
              goto LAB_00119258;
            }
          }
          else if (*(char **)(ctx->__size + 0x28428) == (char *)0x0) {
            local_278 = CONCAT44(extraout_var,iVar3);
            memset((utsname *)&name,0,0x186);
            uname((utsname *)&name);
            pcVar15 = mg_strdup((char *)&name);
            *(char **)(ctx->__size + 0x282d8) = pcVar15;
            name.sysname[0x20] = '\0';
            name.sysname[0x21] = '\0';
            name.sysname[0x22] = '\0';
            name.sysname[0x23] = '\0';
            name.sysname[0x24] = '\0';
            name.sysname[0x25] = '\0';
            name.sysname[0x26] = '\0';
            name.sysname[0x27] = '\0';
            name.sysname[0x10] = '\0';
            name.sysname[0x11] = '\0';
            name.sysname[0x12] = '\0';
            name.sysname[0x13] = '\0';
            name.sysname[0x14] = '\0';
            name.sysname[0x15] = '\0';
            name.sysname[0x16] = '\0';
            name.sysname[0x17] = '\0';
            name.sysname[0x18] = '\0';
            name.sysname[0x19] = '\0';
            name.sysname[0x1a] = '\0';
            name.sysname[0x1b] = '\0';
            name.sysname[0x1c] = '\0';
            name.sysname[0x1d] = '\0';
            name.sysname[0x1e] = '\0';
            name.sysname[0x1f] = '\0';
            name.sysname[0] = '\0';
            name.sysname[1] = '\0';
            name.sysname[2] = '\0';
            name.sysname[3] = '\0';
            name.sysname[4] = '\0';
            name.sysname[5] = '\0';
            name.sysname[6] = '\0';
            name.sysname[7] = '\0';
            name.sysname[8] = '\0';
            name.sysname[9] = '\0';
            name.sysname[10] = '\0';
            name.sysname[0xb] = '\0';
            name.sysname[0xc] = '\0';
            name.sysname[0xd] = '\0';
            name.sysname[0xe] = '\0';
            name.sysname[0xf] = '\0';
            pmVar20 = *(mg_connection **)(ctx->__size + 0x284c8);
            if ((pmVar20 == (mg_connection *)0x0) ||
               (iVar3 = mg_stat(pmVar20,name.sysname,filep), iVar3 != 0)) {
              off = 0;
              on = 1;
              _local_2e8 = 0;
              uStack_2e0 = 0;
              local_2d8 = 0;
              uStack_2d0 = 0;
              local_2c8 = 0;
              uStack_2c0 = 0;
              local_2b8 = 0;
              _auStack_2b0 = 0;
              usa._0_8_ = 0;
              usa._8_4_ = 0;
              usa._12_4_ = 0;
              usa._16_4_ = 0;
              usa._20_8_ = 0;
              local_2ec = 0x1c;
              pcVar15 = *(char **)(ctx->__size + 0x283b0);
              local_2a0 = 0;
              uVar32 = 0;
LAB_001193b1:
              puVar12 = (uint *)&len;
              pcVar15 = next_option(pcVar15,&vec,(vec *)0x0);
              uVar7 = (uint)pcVar23;
              if (pcVar15 == (char *)0x0) goto LAB_00119be3;
              uVar32 = (ulong)((int)uVar32 + 1);
              buf[0x50] = '\0';
              buf[0x51] = '\0';
              buf[0x52] = '\0';
              buf[0x53] = '\0';
              buf[0x54] = '\0';
              buf[0x55] = '\0';
              buf[0x56] = '\0';
              buf[0x57] = '\0';
              buf[0x58] = '\0';
              buf[0x59] = '\0';
              buf[0x5a] = '\0';
              buf[0x5b] = '\0';
              buf[0x5c] = '\0';
              buf[0x5d] = '\0';
              buf[0x5e] = '\0';
              buf[0x5f] = '\0';
              buf[0x40] = '\0';
              buf[0x41] = '\0';
              buf[0x42] = '\0';
              buf[0x43] = '\0';
              buf[0x44] = '\0';
              buf[0x45] = '\0';
              buf[0x46] = '\0';
              buf[0x47] = '\0';
              buf[0x48] = '\0';
              buf[0x49] = '\0';
              buf[0x4a] = '\0';
              buf[0x4b] = '\0';
              buf[0x4c] = '\0';
              buf[0x4d] = '\0';
              buf[0x4e] = '\0';
              buf[0x4f] = '\0';
              buf[0x30] = '\0';
              buf[0x31] = '\0';
              buf[0x32] = '\0';
              buf[0x33] = '\0';
              buf[0x34] = '\0';
              buf[0x35] = '\0';
              buf[0x36] = '\0';
              buf[0x37] = '\0';
              buf[0x38] = '\0';
              buf[0x39] = '\0';
              buf[0x3a] = '\0';
              buf[0x3b] = '\0';
              buf[0x3c] = '\0';
              buf[0x3d] = '\0';
              buf[0x3e] = '\0';
              buf[0x3f] = '\0';
              buf[0x20] = '\0';
              buf[0x21] = '\0';
              buf[0x22] = '\0';
              buf[0x23] = '\0';
              buf[0x24] = '\0';
              buf[0x25] = '\0';
              buf[0x26] = '\0';
              buf[0x27] = '\0';
              buf[0x28] = '\0';
              buf[0x29] = '\0';
              buf[0x2a] = '\0';
              buf[0x2b] = '\0';
              buf[0x2c] = '\0';
              buf[0x2d] = '\0';
              buf[0x2e] = '\0';
              buf[0x2f] = '\0';
              buf[0x10] = '\0';
              buf[0x11] = '\0';
              buf[0x12] = '\0';
              buf[0x13] = '\0';
              buf[0x14] = '\0';
              buf[0x15] = '\0';
              buf[0x16] = '\0';
              buf[0x17] = '\0';
              buf[0x18] = '\0';
              buf[0x19] = '\0';
              buf[0x1a] = '\0';
              buf[0x1b] = '\0';
              buf[0x1c] = '\0';
              buf[0x1d] = '\0';
              buf[0x1e] = '\0';
              buf[0x1f] = '\0';
              buf[0] = '\0';
              buf[1] = '\0';
              buf[2] = '\0';
              buf[3] = '\0';
              buf[4] = '\0';
              buf[5] = '\0';
              buf[6] = '\0';
              buf[7] = '\0';
              buf[8] = '\0';
              buf[9] = '\0';
              buf[10] = '\0';
              buf[0xb] = '\0';
              buf[0xc] = '\0';
              buf[0xd] = '\0';
              buf[0xe] = '\0';
              buf[0xf] = '\0';
              buf[0x60] = '\0';
              buf[0x61] = '\0';
              buf[0x62] = '\0';
              buf[99] = '\0';
              uStack_2e0 = 0;
              local_2d8 = 0;
              uStack_2d0 = 0;
              local_2c8 = 0;
              uStack_2c0 = 0;
              local_2b8 = 0;
              _auStack_2b0 = 0;
              _local_2e8 = 0x200000000;
              port = 0;
              len = 0;
              iVar3 = __isoc99_sscanf(vec.ptr,"%u.%u.%u.%u:%u%n",&a,&b,&c,&d,&port);
              if (iVar3 != 5) {
                iVar3 = __isoc99_sscanf(vec.ptr,"[%49[^]]]:%u%n",buf,&port);
                if (((iVar3 == 2) && ((ulong)(long)len <= CONCAT44(vec.len._4_4_,(uint)vec.len))) &&
                   (iVar3 = mg_inet_pton(10,buf,local_2e8 + 4,0x1c,0), iVar3 != 0)) {
                  _local_2e8 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_2e8);
                  uStack_330 = 6;
                  puVar12 = extraout_RDX_00;
                  goto LAB_001194b9;
                }
                if ((*vec.ptr == '+') &&
                   (iVar3 = __isoc99_sscanf(vec.ptr + 1,"%u%n",&port,puVar12), iVar3 == 1)) {
                  len = len + 1;
                  local_2e8 = (undefined1  [6])CONCAT24(10,local_2e8._0_4_);
                  uVar16 = (ulong)port;
                  _local_2e8 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_2e8);
                  uStack_330 = 10;
                  puVar12 = extraout_RDX_01;
                  goto LAB_001194be;
                }
                uVar16 = strtoul(vec.ptr,&endptr,0);
                pcVar23 = vec.ptr;
                if ((uVar16 < 0x10000) && (vec.ptr != endptr)) {
                  len = (int)endptr - (int)vec.ptr;
                  port = (uint)uVar16;
                  _local_2e8 = CONCAT26((ushort)uVar16 << 8 | (ushort)uVar16 >> 8,local_2e8);
                  uStack_330 = 4;
                  puVar12 = extraout_RDX_04;
                  pmVar30 = local_318;
                  goto LAB_001194be;
                }
                pcVar26 = strchr(vec.ptr,0x3a);
                piVar21 = (int *)CONCAT44(vec.len._4_4_,(uint)vec.len);
                puVar12 = extraout_RDX_05;
                pmVar30 = local_318;
                if ((pcVar26 != (char *)0x0) &&
                   (piVar25 = (int *)(pcVar26 + -(long)pcVar23),
                   piVar25 < (int *)0x100 && piVar25 < piVar21)) {
                  mg_strlcpy(name.sysname,pcVar23,(size_t)((long)piVar25 + 1));
                  iVar3 = mg_inet_pton(2,name.sysname,local_2e8 + 4,0x10,1);
                  iVar4 = (int)(char *)((long)piVar25 + 1);
                  if (iVar3 == 0) {
                    iVar3 = mg_inet_pton(10,name.sysname,local_2e8 + 4,0x1c,1);
                    puVar12 = &port;
                    if (iVar3 == 0) goto LAB_001199d9;
                    iVar3 = __isoc99_sscanf(pcVar26 + 1,"%u%n",puVar12,&len);
                    pmVar30 = local_318;
                    puVar12 = extraout_RDX_11;
                    if (iVar3 == 1) {
                      _local_2e8 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_2e8);
                      len = len + iVar4;
                      uStack_330 = 6;
                    }
                    else {
                      len = 0;
                      uStack_330 = 0;
                    }
                  }
                  else {
                    iVar3 = __isoc99_sscanf(pcVar26 + 1,"%u%n",&port,&len);
                    puVar12 = extraout_RDX_06;
                    if (iVar3 == 1) {
                      _local_2e8 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_2e8);
                      len = len + iVar4;
                      uStack_330 = 4;
                      pmVar30 = local_318;
                    }
                    else {
LAB_001199d9:
                      len = 0;
                      uStack_330 = 0;
                      pmVar30 = local_318;
                    }
                  }
                  goto LAB_001194b9;
                }
LAB_001197b1:
                pcVar23 = "[IP_ADDRESS:]PORT[s|r]";
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)ctx,(char *)puVar12,0x1529fc,
                           "%.*s: invalid port spec (entry %i). Expecting list of: %s",piVar21,
                           vec.ptr,uVar32,"[IP_ADDRESS:]PORT[s|r]");
                goto LAB_001193b1;
              }
              uVar7 = c << 8 | b << 0x10 | a << 0x18 | d;
              uStack_2e0 = CONCAT44(uStack_2e0._4_4_,
                                    uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8
                                    | d << 0x18);
              _local_2e8 = CONCAT26((ushort)port << 8 | (ushort)port >> 8,local_2e8);
              uStack_330 = 4;
LAB_001194b9:
              uVar16 = (ulong)port;
LAB_001194be:
              pcVar23 = (char *)(long)len;
              piVar21 = (int *)CONCAT44(vec.len._4_4_,(uint)vec.len);
              if ((((long)pcVar23 < 1) || (0xffff < (uint)uVar16)) ||
                 (piVar25 = (int *)((long)pcVar23 + 1),
                 puVar12 = (uint *)CONCAT71((int7)((ulong)piVar25 >> 8),
                                            piVar25 == piVar21 || piVar21 == (int *)pcVar23),
                 piVar25 != piVar21 && piVar21 != (int *)pcVar23)) goto LAB_001197b1;
              if (pcVar23 < piVar21) {
                bVar2 = vec.ptr[(long)pcVar23];
                _auStack_2b0 = CONCAT15(bVar2 == 0x72,CONCAT14(bVar2 == 0x73,auStack_2b0._0_4_));
                pcVar23 = (char *)(ulong)(bVar2 - 0x72);
                if ((1 < bVar2 - 0x72) && (bVar2 != 0)) goto LAB_001197b1;
              }
              else {
                _auStack_2b0 = (uint6)(uint)auStack_2b0._0_4_;
              }
              iVar3 = socket((uint)(ushort)local_2e8._4_2_,1,6);
              _local_2e8 = CONCAT44(stack0xfffffffffffffd1c,iVar3);
              if (iVar3 == -1) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)ctx,func_04,(uint)pcVar23,
                           "cannot create socket (entry %i)",uVar32);
                goto LAB_001193b1;
              }
              pcVar23 = (char *)&on;
              iVar3 = setsockopt(iVar3,1,2,pcVar23,4);
              pcVar26 = func_05;
              if (iVar3 != 0) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)ctx,func_05,(uint)pcVar23,
                           "cannot set socket option SO_REUSEADDR (entry %i)",uVar32);
                pcVar26 = extraout_RDX_02;
              }
              if (uStack_330 < 5) {
LAB_00119844:
              }
              else if (uStack_330 < 7) {
                if (local_2e8._4_2_ == 10) {
                  pcVar23 = (char *)&on;
                  iVar3 = setsockopt(local_2e8._0_4_,0x29,0x1a,pcVar23,4);
                  pcVar27 = "cannot set socket option IPV6_V6ONLY=on (entry %i)";
                  pcVar26 = extraout_RDX_07;
                  goto LAB_00119831;
                }
              }
              else if (local_2e8._4_2_ == 10) {
                pcVar23 = (char *)&off;
                iVar3 = setsockopt(local_2e8._0_4_,0x29,0x1a,pcVar23,4);
                pcVar27 = "cannot set socket option IPV6_V6ONLY=off (entry %i)";
                pcVar26 = extraout_RDX_03;
LAB_00119831:
                if (iVar3 != 0) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)ctx,pcVar26,(uint)pcVar23,pcVar27,
                             uVar32);
                  pcVar26 = extraout_RDX_08;
                }
                goto LAB_00119844;
              }
              if (local_2e8._4_2_ == 10) {
                local_2ec = 0x1c;
                iVar3 = bind(local_2e8._0_4_,(sockaddr *)(local_2e8 + 4),0x1c);
                uVar7 = (uint)vec.len;
                pcVar26 = vec.ptr;
                if (iVar3 != 0) {
                  puVar12 = (uint *)__errno_location();
                  uVar16 = (ulong)*puVar12;
                  pcVar23 = strerror(*puVar12);
                  fmt = "cannot bind to IPv6 %.*s: %d (%s)";
                  pcVar27 = extraout_RDX_10;
                  goto LAB_00119b3b;
                }
LAB_00119929:
                pcVar26 = *(char **)(ctx->__size + 0x283e8);
                lVar24 = strtol(pcVar26,(char **)0x0,10);
                pcVar23 = (char *)(lVar24 - 0x80000000);
                if (pcVar23 < (int *)0xffffffff80000001) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)ctx,(char *)0xffffffff80000000,
                             (uint)pcVar23,"%s value \"%s\" is invalid","listen_backlog",pcVar26);
                  pcVar23 = (char *)0x11993d;
                  goto LAB_00119b4e;
                }
                iVar3 = listen(local_2e8._0_4_,(int)lVar24);
                uVar7 = (uint)vec.len;
                pcVar26 = vec.ptr;
                if (iVar3 == 0) {
                  iVar3 = getsockname(local_2e8._0_4_,(sockaddr *)&usa.sa,&local_2ec);
                  if (iVar3 == 0) {
                    if (usa.sa.sa_family == local_2e8._4_2_) {
                      _local_2e8 = CONCAT26(usa.sin.sin_port,local_2e8);
                      psVar14 = (socket *)
                                realloc(*(socket **)(ctx->__size + 8),
                                        (ulong)(*(uint *)(ctx->__size + 0x18) + 1) << 6);
                      if (psVar14 == (socket *)0x0) {
                        mg_cry_internal_wrap
                                  ((mg_connection *)0x0,(mg_context *)ctx,func_06,(uint)pcVar23,"%s"
                                   ,"Out of memory");
                        close(local_2e8._0_4_);
                        _local_2e8 = CONCAT44(stack0xfffffffffffffd1c,0xffffffff);
                        pmVar30 = local_318;
                      }
                      else {
                        ppVar17 = (pollfd *)
                                  realloc(*(pollfd **)(ctx->__size + 0x10),
                                          (ulong)(*(uint *)(ctx->__size + 0x18) + 1) << 3);
                        if (ppVar17 == (pollfd *)0x0) {
                          mg_cry_internal_wrap
                                    ((mg_connection *)0x0,(mg_context *)ctx,(char *)ctx_00,
                                     (uint)pcVar23,"%s","Out of memory");
                          close(local_2e8._0_4_);
                          _local_2e8 = CONCAT44(stack0xfffffffffffffd1c,0xffffffff);
                          free(psVar14);
                          pmVar30 = local_318;
                        }
                        else {
                          set_close_on_exec(local_2e8._0_4_,(mg_connection *)ctx,ctx_00);
                          *(socket **)(ctx->__size + 8) = psVar14;
                          uVar7 = *(uint *)(ctx->__size + 0x18);
                          pcVar23 = (char *)(ulong)(uVar7 + 1);
                          puVar1 = (undefined8 *)((long)&psVar14[uVar7].rsa + 0x10);
                          *puVar1 = local_2b8;
                          puVar1[1] = _auStack_2b0;
                          *(undefined8 *)&psVar14[uVar7].rsa = local_2c8;
                          *(undefined8 *)((long)&psVar14[uVar7].rsa + 8) = uStack_2c0;
                          puVar1 = (undefined8 *)((long)&psVar14[uVar7].lsa + 0xc);
                          *puVar1 = local_2d8;
                          puVar1[1] = uStack_2d0;
                          *(undefined8 *)(psVar14 + uVar7) = _local_2e8;
                          *(undefined8 *)((long)&psVar14[uVar7].lsa + 4) = uStack_2e0;
                          *(pollfd **)(ctx->__size + 0x10) = ppVar17;
                          *(uint *)(ctx->__size + 0x18) = uVar7 + 1;
                          local_2a0 = local_2a0 + 1;
                          pmVar30 = local_318;
                        }
                      }
                      goto LAB_001193b1;
                    }
                  }
                  puVar12 = (uint *)__errno_location();
                  uVar7 = (uint)vec.len;
                  pcVar26 = vec.ptr;
                  uVar16 = (ulong)*puVar12;
                  pcVar23 = strerror(*puVar12);
                  fmt = "call to getsockname failed %.*s: %d (%s)";
                  pcVar27 = extraout_RDX_13;
                  goto LAB_00119b3b;
                }
                puVar12 = (uint *)__errno_location();
                uVar16 = (ulong)*puVar12;
                pcVar23 = strerror(*puVar12);
                fmt = "cannot listen to %.*s: %d (%s)";
                pcVar27 = extraout_RDX_12;
              }
              else {
                if (local_2e8._4_2_ != 2) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)ctx,pcVar26,(uint)pcVar23,
                             "cannot bind: address family not supported (entry %i)",uVar32);
                  close(local_2e8._0_4_);
                  _local_2e8 = CONCAT44(stack0xfffffffffffffd1c,0xffffffff);
                  goto LAB_001193b1;
                }
                local_2ec = 0x10;
                iVar3 = bind(local_2e8._0_4_,(sockaddr *)(local_2e8 + 4),0x10);
                uVar7 = (uint)vec.len;
                pcVar26 = vec.ptr;
                if (iVar3 == 0) goto LAB_00119929;
                puVar12 = (uint *)__errno_location();
                uVar16 = (ulong)*puVar12;
                pcVar23 = strerror(*puVar12);
                fmt = "cannot bind to %.*s: %d (%s)";
                pcVar27 = extraout_RDX_09;
              }
LAB_00119b3b:
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,(mg_context *)ctx,pcVar27,(uint)pcVar23,fmt,
                         (ulong)uVar7,pcVar26,uVar16,pcVar23);
LAB_00119b4e:
              close(local_2e8._0_4_);
              _local_2e8 = CONCAT44(stack0xfffffffffffffd1c,0xffffffff);
              pmVar30 = local_318;
              goto LAB_001193b1;
            }
            piVar21 = __errno_location();
            pcVar23 = strerror(*piVar21);
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)ctx,func_10,(uint)pcVar23,
                       "Cannot open %s: %s",pmVar20,pcVar23);
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)ctx,func_11,0x119d69,"%s",
                       "Invalid global password file");
            if (pmVar30 != (mg_error_data *)0x0) {
              pmVar30->code = 0xd;
              pcVar15 = pmVar30->text;
              sVar22 = pmVar30->text_buffer_size;
              pcVar26 = "%s";
              pcVar23 = "Invalid global password file";
              goto LAB_00119258;
            }
          }
          else {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,(mg_context *)ctx,(char *)0xfffeffff,uVar7,"%s",
                       "Document root must not be set");
            if (pmVar30 != (mg_error_data *)0x0) {
              pmVar30->code = 2;
              pmVar30->code_sub = 0xf;
              pcVar15 = pmVar30->text;
              sVar22 = pmVar30->text_buffer_size;
              pcVar26 = "Invalid configuration option value: %s";
              pcVar23 = "document_root";
              goto LAB_00119258;
            }
          }
        }
      }
    }
    goto LAB_0011925f;
  }
  puVar12 = (uint *)__errno_location();
  uVar8 = *puVar12;
  mg_cry_internal_wrap
            ((mg_connection *)0x0,(mg_context *)ctx,func,uVar7,"%s",
             "Cannot initialize thread synchronization objects");
  if (local_318 != (mg_error_data *)0x0) {
    local_318->code = 9;
    local_318->code_sub = uVar8;
    mg_snprintf((mg_connection *)0x0,(int *)0x0,local_318->text,local_318->text_buffer_size,"%s",
                "Cannot initialize thread synchronization objects");
  }
  free(ctx);
LAB_00119267:
  ctx = (pthread_mutexattr_t *)0x0;
LAB_0011926f:
  pthread_setspecific(sTlsKey,(void *)0x0);
  return (mg_context *)ctx;
LAB_00119be3:
  if ((int)uVar32 == local_2a0) {
    pcVar15 = extraout_RDX;
    if (local_2a0 != 0) {
      _Var9 = getuid();
      piVar21 = *(int **)(ctx->__size + 0x283c0);
      if (piVar21 != (int *)0x0) {
        uStack_330 = 0x119c16;
        ppVar18 = getpwnam((char *)piVar21);
        if (ppVar18 == (passwd *)0x0) {
          pcVar26 = "%s: unknown user [%s]";
          pcVar15 = extraout_RDX_14;
        }
        else {
          if (_Var9 == ppVar18->pw_uid) goto LAB_00119c2b;
          iVar3 = setgid(ppVar18->pw_gid);
          if (iVar3 == -1) {
            piVar25 = __errno_location();
            pcVar23 = strerror(*piVar25);
            pcVar26 = "%s: setgid(%s): %s";
            pcVar15 = extraout_RDX_17;
          }
          else {
            iVar3 = setgroups(0,(__gid_t *)0x0);
            if (iVar3 == -1) {
              piVar21 = __errno_location();
              uStack_330 = 0x119fff;
              pcVar23 = strerror(*piVar21);
              pcVar26 = "%s: setgroups(): %s";
              pcVar15 = extraout_RDX_18;
              piVar21 = (int *)pcVar23;
              goto LAB_00119fa3;
            }
            iVar3 = setuid(ppVar18->pw_uid);
            if (iVar3 != -1) goto LAB_00119c2b;
            piVar25 = __errno_location();
            pcVar23 = strerror(*piVar25);
            pcVar26 = "%s: setuid(%s): %s";
            pcVar15 = extraout_RDX_16;
          }
          uStack_330 = (uint)pcVar23;
        }
LAB_00119fa3:
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,pcVar15,(uint)pcVar23,pcVar26,
                   "set_uid_option",piVar21);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_13,uStack_330,"%s",
                   "Failed to run as configured user");
        if (local_318 == (mg_error_data *)0x0) goto LAB_0011925f;
        local_318->code = 0xb;
        pcVar15 = local_318->text;
        sVar22 = local_318->text_buffer_size;
        pcVar26 = "%s";
        pcVar23 = "Failed to run as configured user";
        goto LAB_00119258;
      }
LAB_00119c2b:
      name.sysname[8] = '\0';
      name.sysname[9] = '\0';
      name.sysname[10] = '\0';
      name.sysname[0xb] = '\0';
      name.sysname[0xc] = '\0';
      name.sysname[0xd] = '\0';
      name.sysname[0xe] = '\0';
      name.sysname[0xf] = '\0';
      name.sysname[0x10] = '\0';
      name.sysname[0x11] = '\0';
      name.sysname[0x12] = '\0';
      name.sysname[0x13] = '\0';
      name.sysname[0x14] = '\0';
      name.sysname[0x15] = '\0';
      name.sysname[0x16] = '\0';
      name.sysname[0x17] = '\0';
      name.sysname[0x18] = '\0';
      name.sysname[0x19] = '\0';
      name.sysname[0x1a] = '\0';
      name.sysname[0x1b] = '\0';
      name.sysname[0] = '\n';
      name.sysname[1] = '\0';
      name.sysname[2] = '\0';
      name.sysname[3] = '\0';
      name.sysname[4] = '\0';
      name.sysname[5] = '\0';
      name.sysname[6] = '\0';
      name.sysname[7] = '\0';
      iVar3 = check_acl((mg_context *)ctx,(usa *)&name);
      if (iVar3 == -1) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,(mg_context *)ctx,func_07,(uint)pcVar23,"%s",
                   "Failed to setup access control list");
        if (local_318 != (mg_error_data *)0x0) {
          local_318->code = 0xc;
          pcVar15 = local_318->text;
          sVar22 = local_318->text_buffer_size;
          pcVar26 = "%s";
          pcVar23 = "Failed to setup access control list";
          goto LAB_00119258;
        }
      }
      else {
        *(uint *)(ctx->__size + 0x60) = (uint)local_278;
        uVar32 = local_278 & 0xffffffff;
        ppVar19 = (pthread_t *)calloc(uVar32,8);
        pmVar30 = local_318;
        *(pthread_t **)(ctx->__size + 0x68) = ppVar19;
        if (ppVar19 == (pthread_t *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,(mg_context *)ctx,func_08,(uint)pcVar23,"%s",
                     "Not enough memory for worker thread ID array");
          if (pmVar30 != (mg_error_data *)0x0) {
            pmVar30->code = 6;
            pmVar30->code_sub = *(uint *)(ctx->__size + 0x60) << 3;
            pcVar15 = pmVar30->text;
            sVar22 = pmVar30->text_buffer_size;
            pcVar26 = "%s";
            pcVar23 = "Not enough memory for worker thread ID array";
            goto LAB_00119258;
          }
        }
        else {
          pmVar20 = (mg_connection *)calloc(uVar32,0x9e8);
          *(mg_connection **)(ctx->__size + 0x20) = pmVar20;
          if (pmVar20 != (mg_connection *)0x0) {
            if (*(_func_void_mg_context_ptr **)(ctx->__size + 0x28378) !=
                (_func_void_mg_context_ptr *)0x0) {
              (**(_func_void_mg_context_ptr **)(ctx->__size + 0x28378))((mg_context *)ctx);
            }
            *(_func_void_mg_context_ptr **)(ctx->__size + 0x28380) = local_298;
            ctx->__align = 1;
            lVar31 = 0;
            lVar24 = 0;
            for (uVar32 = 0; uVar32 < *(uint *)(ctx->__size + 0x60); uVar32 = uVar32 + 1) {
              pmVar20 = *(mg_connection **)(ctx->__size + 0x20);
              *(pthread_mutexattr_t **)((long)&pmVar20->phys_ctx + lVar24) = ctx;
              iVar3 = mg_start_thread_with_id
                                (worker_thread,(pmVar20->request_info).remote_addr + lVar24 + -0x48,
                                 (pthread_t *)((long)*(pthread_t **)(ctx->__size + 0x68) + lVar31));
              uVar7 = (uint)pcVar23;
              if (iVar3 != 0) {
                puVar12 = (uint *)__errno_location();
                uVar8 = *puVar12;
                pcVar23 = (char *)(long)(int)uVar8;
                if (uVar32 == 0) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)ctx,func_12,uVar7,
                             "Cannot create threads: error %ld",pcVar23);
                  if (local_318 == (mg_error_data *)0x0) goto LAB_0011925f;
                  local_318->code = 9;
                  local_318->code_sub = uVar8;
                  pcVar15 = local_318->text;
                  sVar22 = local_318->text_buffer_size;
                  pcVar26 = "Cannot create first worker thread: error %ld";
                  goto LAB_00119258;
                }
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)ctx,func_12,uVar7,
                           "Cannot start worker thread %i: error %ld",(ulong)((int)uVar32 + 1),
                           pcVar23);
                break;
              }
              lVar24 = lVar24 + 0x9e8;
              lVar31 = lVar31 + 8;
            }
            mg_start_thread_with_id(master_thread,ctx,(pthread_t *)(ctx->__size + 0x58));
            goto LAB_0011926f;
          }
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,(mg_context *)ctx,func_09,(uint)pcVar23,"%s",
                     "Not enough memory for worker thread connection array");
          if (pmVar30 != (mg_error_data *)0x0) {
            pmVar30->code = 6;
            pmVar30->code_sub = *(uint *)(ctx->__size + 0x60) * 0x9e8;
            pcVar15 = pmVar30->text;
            sVar22 = pmVar30->text_buffer_size;
            pcVar26 = "%s";
            pcVar23 = "Not enough memory for worker thread connection array";
            goto LAB_00119258;
          }
        }
      }
      goto LAB_0011925f;
    }
  }
  else {
    close_all_listening_sockets((mg_context *)ctx);
    pcVar15 = extraout_RDX_15;
  }
  mg_cry_internal_wrap
            ((mg_connection *)0x0,(mg_context *)ctx,pcVar15,uVar7,"%s",
             "Failed to setup server ports");
  if (pmVar30 != (mg_error_data *)0x0) {
    pmVar30->code = 10;
    pcVar15 = pmVar30->text;
    sVar22 = pmVar30->text_buffer_size;
    pcVar26 = "%s";
    pcVar23 = "Failed to setup server ports";
    goto LAB_00119258;
  }
LAB_0011925f:
  free_context((mg_context *)ctx);
  goto LAB_00119267;
}

Assistant:

mg_context *
mg_start2(struct mg_init_data *init, struct mg_error_data *error)
{
	struct mg_context *ctx;
	const char *name, *value, *default_value;
	int idx, ok, workerthreadcount;
	unsigned int i;
	int itmp;
	void (*exit_callback)(const struct mg_context *ctx) = 0;
	const char **options =
	    ((init != NULL) ? (init->configuration_options) : (NULL));

	struct mg_workerTLS tls;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if (mg_init_library_called == 0) {
		/* Legacy INIT, if mg_start is called without mg_init_library.
		 * Note: This will cause a memory leak when unloading the library.
		 */
		legacy_init(options);
	}
	if (mg_init_library_called == 0) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_LIBRARY_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Library uninitialized");
		}
		return NULL;
	}

	/* Allocate context and initialize reasonable general case defaults. */
	ctx = (struct mg_context *)mg_calloc(1, sizeof(*ctx));
	if (ctx == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(*ctx);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out of memory");
		}
		return NULL;
	}

	/* Random number generator will initialize at the first call */
	ctx->dd.auth_nonce_mask =
	    (uint64_t)get_random() ^ (uint64_t)(ptrdiff_t)(options);

	/* Save started thread index to reuse in other external API calls
	 * For the sake of thread synchronization all non-civetweb threads
	 * can be considered as single external thread */
	ctx->starter_thread_idx = (unsigned)mg_atomic_inc(&thread_idx_max);
	tls.is_master = -1; /* Thread calling mg_start */
	tls.thread_idx = ctx->starter_thread_idx;
#if defined(_WIN32)
	tls.pthread_cond_helper_mutex = NULL;
#endif
	pthread_setspecific(sTlsKey, &tls);

	ok = (0 == pthread_mutex_init(&ctx->thread_mutex, &pthread_mutex_attr));
#if !defined(ALTERNATIVE_QUEUE)
	ok &= (0 == pthread_cond_init(&ctx->sq_empty, NULL));
	ok &= (0 == pthread_cond_init(&ctx->sq_full, NULL));
	ctx->sq_blocked = 0;
#endif
	ok &= (0 == pthread_mutex_init(&ctx->nonce_mutex, &pthread_mutex_attr));
#if defined(USE_LUA)
	ok &= (0 == pthread_mutex_init(&ctx->lua_bg_mutex, &pthread_mutex_attr));
#endif
	if (!ok) {
		unsigned error_id = (unsigned)ERRNO;
		const char *err_msg =
		    "Cannot initialize thread synchronization objects";
		/* Fatal error - abort start. However, this situation should never
		 * occur in practice. */

		mg_cry_ctx_internal(ctx, "%s", err_msg);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = error_id;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		mg_free(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	if ((init != NULL) && (init->callbacks != NULL)) {
		/* Set all callbacks except exit_context. */
		ctx->callbacks = *init->callbacks;
		exit_callback = init->callbacks->exit_context;
		/* The exit callback is activated once the context is successfully
		 * created. It should not be called, if an incomplete context object
		 * is deleted during a failed initialization. */
		ctx->callbacks.exit_context = 0;
	}
	ctx->user_data = ((init != NULL) ? (init->user_data) : (NULL));
	ctx->dd.handlers = NULL;
	ctx->dd.next = NULL;

#if defined(USE_LUA)
	lua_ctx_init(ctx);
#endif

	/* Store options */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;

		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option value: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
		if (ctx->dd.config[idx] != NULL) {
			/* A duplicate configuration option is not an error - the last
			 * option value will be used. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(ctx->dd.config[idx]);
		}
		ctx->dd.config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Set default value if needed */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = config_options[i].default_value;
		if ((ctx->dd.config[i] == NULL) && (default_value != NULL)) {
			ctx->dd.config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	/* Request size option */
	itmp = atoi(ctx->dd.config[MAX_REQUEST_SIZE]);
	if (itmp < 1024) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[MAX_REQUEST_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)MAX_REQUEST_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[MAX_REQUEST_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->max_request_size = (unsigned)itmp;

	/* Queue length */
#if !defined(ALTERNATIVE_QUEUE)
	itmp = atoi(ctx->dd.config[CONNECTION_QUEUE_SIZE]);
	if (itmp < 1) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = CONNECTION_QUEUE_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->squeue =
	    (struct socket *)mg_calloc((unsigned int)itmp, sizeof(struct socket));
	if (ctx->squeue == NULL) {
		mg_cry_ctx_internal(ctx,
		                    "Out of memory: Cannot allocate %s",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)itmp * (unsigned)sizeof(struct socket);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Out of memory: Cannot allocate %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->sq_size = itmp;
#endif

	/* Worker thread count option */
	workerthreadcount = atoi(ctx->dd.config[NUM_THREADS]);

	if ((workerthreadcount > MAX_WORKER_THREADS) || (workerthreadcount <= 0)) {
		if (workerthreadcount <= 0) {
			mg_cry_ctx_internal(ctx, "%s", "Invalid number of worker threads");
		} else {
			mg_cry_ctx_internal(ctx, "%s", "Too many worker threads");
		}
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = NUM_THREADS;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[NUM_THREADS].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	/* Document root */
#if defined(NO_FILES)
	if (ctx->dd.config[DOCUMENT_ROOT] != NULL) {
		mg_cry_ctx_internal(ctx, "%s", "Document root must not be set");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)DOCUMENT_ROOT;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[DOCUMENT_ROOT].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	get_system_name(&ctx->systemName);

#if defined(USE_LUA)
	/* If a Lua background script has been configured, start it. */
	ctx->lua_bg_log_available = 0;
	if (ctx->dd.config[LUA_BACKGROUND_SCRIPT] != NULL) {
		char ebuf[256];
		struct vec opt_vec;
		struct vec eq_vec;
		const char *sparams;

		memset(ebuf, 0, sizeof(ebuf));
		pthread_mutex_lock(&ctx->lua_bg_mutex);

		/* Create a Lua state, load all standard libraries and the mg table */
		lua_State *state = mg_lua_context_script_prepare(
		    ctx->dd.config[LUA_BACKGROUND_SCRIPT], ctx, ebuf, sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script load error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[LUA_BACKGROUND_SCRIPT].name,
				            ebuf);
			}

			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* Add a table with parameters into mg.params */
		sparams = ctx->dd.config[LUA_BACKGROUND_SCRIPT_PARAMS];
		if (sparams && sparams[0]) {
			lua_getglobal(state, "mg");
			lua_pushstring(state, "params");
			lua_newtable(state);

			while ((sparams = next_option(sparams, &opt_vec, &eq_vec))
			       != NULL) {
				reg_llstring(
				    state, opt_vec.ptr, opt_vec.len, eq_vec.ptr, eq_vec.len);
				if (mg_strncasecmp(sparams, opt_vec.ptr, opt_vec.len) == 0)
					break;
			}
			lua_rawset(state, -3);
			lua_pop(state, 1);
		}

		/* Call script */
		state = mg_lua_context_script_run(state,
		                                  ctx->dd.config[LUA_BACKGROUND_SCRIPT],
		                                  ctx,
		                                  ebuf,
		                                  sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script start error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[DOCUMENT_ROOT].name,
				            ebuf);
			}
			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* state remains valid */
		ctx->lua_background_state = (void *)state;
		pthread_mutex_unlock(&ctx->lua_bg_mutex);

	} else {
		ctx->lua_background_state = 0;
	}
#endif

	/* Step by step initialization of ctx - depending on build options */
#if !defined(NO_FILESYSTEMS)
	if (!set_gpass_option(ctx, NULL)) {
		const char *err_msg = "Invalid global password file";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PASS_FILE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}
		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

#if defined(USE_MBEDTLS)
	if (!mg_sslctx_init(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#elif !defined(NO_SSL)
	if (!init_ssl_ctx(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_ports_option(ctx)) {
		const char *err_msg = "Failed to setup server ports";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_PORTS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if !defined(_WIN32) && !defined(__ZEPHYR__)
	if (!set_uid_option(ctx)) {
		const char *err_msg = "Failed to run as configured user";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_USER_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_acl_option(ctx)) {
		const char *err_msg = "Failed to setup access control list";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_ACL_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->cfg_worker_threads = ((unsigned int)(workerthreadcount));
	ctx->worker_threadids = (pthread_t *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                                   sizeof(pthread_t),
	                                                   ctx);

	if (ctx->worker_threadids == NULL) {
		const char *err_msg = "Not enough memory for worker thread ID array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub =
			    (unsigned)ctx->cfg_worker_threads * (unsigned)sizeof(pthread_t);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->worker_connections =
	    (struct mg_connection *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                          sizeof(struct mg_connection),
	                                          ctx);
	if (ctx->worker_connections == NULL) {
		const char *err_msg =
		    "Not enough memory for worker thread connection array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(struct mg_connection);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if defined(ALTERNATIVE_QUEUE)
	ctx->client_wait_events =
	    (void **)mg_calloc_ctx(ctx->cfg_worker_threads,
	                           sizeof(ctx->client_wait_events[0]),
	                           ctx);
	if (ctx->client_wait_events == NULL) {
		const char *err_msg = "Not enough memory for worker event array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_wait_events[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->client_socks =
	    (struct socket *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                   sizeof(ctx->client_socks[0]),
	                                   ctx);
	if (ctx->client_socks == NULL) {
		const char *err_msg = "Not enough memory for worker socket array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->client_wait_events);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_socks[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	for (i = 0; (unsigned)i < ctx->cfg_worker_threads; i++) {
		ctx->client_wait_events[i] = event_create();
		if (ctx->client_wait_events[i] == 0) {
			const char *err_msg = "Error creating worker event %i";
			mg_cry_ctx_internal(ctx, err_msg, i);
			while (i > 0) {
				i--;
				event_destroy(ctx->client_wait_events[i]);
			}
			mg_free(ctx->client_socks);
			mg_free(ctx->client_wait_events);
			mg_free(ctx->worker_threadids);

			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_OS_ERROR;
				error->code_sub = (unsigned)ERRNO;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            err_msg,
				            i);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
	}
#endif

#if defined(USE_TIMERS)
	if (timers_init(ctx) != 0) {
		const char *err_msg = "Error creating timers";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	/* Context has been created - init user libraries */
	if (ctx->callbacks.init_context) {
		ctx->callbacks.init_context(ctx);
	}

	/* From now, the context is successfully created.
	 * When it is destroyed, the exit callback should be called. */
	ctx->callbacks.exit_context = exit_callback;
	ctx->context_type = CONTEXT_SERVER; /* server context */

	/* Start worker threads */
	for (i = 0; i < ctx->cfg_worker_threads; i++) {
		/* worker_thread sets up the other fields */
		ctx->worker_connections[i].phys_ctx = ctx;
		if (mg_start_thread_with_id(worker_thread,
		                            &ctx->worker_connections[i],
		                            &ctx->worker_threadids[i])
		    != 0) {

			long error_no = (long)ERRNO;

			/* thread was not created */
			if (i > 0) {
				/* If the second, third, ... thread cannot be created, set a
				 * warning, but keep running. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot start worker thread %i: error %ld",
				                    i + 1,
				                    error_no);

				/* If the server initialization should stop here, all
				 * threads that have already been created must be stopped
				 * first, before any free_context(ctx) call.
				 */

			} else {
				/* If the first worker thread cannot be created, stop
				 * initialization and free the entire server context. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot create threads: error %ld",
				                    error_no);

				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_OS_ERROR;
					error->code_sub = (unsigned)error_no;
					mg_snprintf(
					    NULL,
					    NULL, /* No truncation check for error buffers */
					    error->text,
					    error->text_buffer_size,
					    "Cannot create first worker thread: error %ld",
					    error_no);
				}

				free_context(ctx);
				pthread_setspecific(sTlsKey, NULL);
				return NULL;
			}
			break;
		}
	}

	/* Start master (listening) thread */
	mg_start_thread_with_id(master_thread, ctx, &ctx->masterthreadid);

	pthread_setspecific(sTlsKey, NULL);
	return ctx;
}